

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

int __thiscall re2::RepetitionWalker::ShortVisit(RepetitionWalker *this,Regexp *re,int parent_arg)

{
  ostream *poVar1;
  LogMessage *in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe84;
  char *in_stack_fffffffffffffe88;
  LogMessage *in_stack_fffffffffffffe90;
  
  LogMessage::LogMessage
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe84);
  poVar1 = LogMessage::stream((LogMessage *)&stack0xfffffffffffffe68);
  std::operator<<(poVar1,"RepetitionWalker::ShortVisit called");
  LogMessage::~LogMessage(in_stack_fffffffffffffe60);
  return 0;
}

Assistant:

int RepetitionWalker::ShortVisit(Regexp* re, int parent_arg) {
  // This should never be called, since we use Walk and not
  // WalkExponential.
  LOG(DFATAL) << "RepetitionWalker::ShortVisit called";
  return 0;
}